

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

CMutableTransaction * __thiscall
wallet::wallet_tests::TestSimpleSpend
          (CMutableTransaction *__return_storage_ptr__,wallet_tests *this,CTransaction *from,
          uint32_t index,CKey *key,CScript *pubkey)

{
  CTxOut *pCVar1;
  CScript scriptSigIn;
  CTxOut *this_00;
  undefined4 in_register_0000000c;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  check_type cVar2;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  lazy_ostream local_1b0;
  undefined1 *local_1a0;
  undefined1 *local_198;
  assertion_result local_190;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  FillableSigningProvider keystore;
  undefined1 local_68 [32];
  undefined8 local_48;
  check_type cStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(__return_storage_ptr__);
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)(**(long **)(this + 0x18) + -10000000);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript_const&>
            ((vector<CTxOut,std::allocator<CTxOut>> *)&__return_storage_ptr__->vout,
             (long *)&keystore,(CScript *)CONCAT44(in_register_0000000c,index));
  local_48 = *(undefined8 *)(this + 0x39);
  _cVar2 = *(check_type *)(this + 0x41);
  local_38 = *(undefined8 *)(this + 0x49);
  uStack_30 = *(undefined8 *)(this + 0x51);
  local_68._0_8_ = (char *)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  scriptSigIn.super_CScriptBase._union._8_8_ = in_stack_fffffffffffffe30;
  scriptSigIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffe28;
  scriptSigIn.super_CScriptBase._union._16_8_ = in_stack_fffffffffffffe38;
  scriptSigIn.super_CScriptBase._24_8_ = in_stack_fffffffffffffe40;
  _cStack_40 = _cVar2;
  CTxIn::CTxIn((CTxIn *)&keystore,(uint256)*(uint256 *)(this + 0x39),0,scriptSigIn,
               (uint32_t)local_68);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<CTxIn>
            (&__return_storage_ptr__->vin,(CTxIn *)&keystore);
  CTxIn::~CTxIn((CTxIn *)&keystore);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_68);
  keystore.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FillableSigningProvider_0114aee0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._8_8_ = 0;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  keystore.cs_KeyStore.super_recursive_mutex.super___recursive_mutex_base._M_mutex._16_8_ = 1;
  keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       keystore.mapScripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FillableSigningProvider::AddKey(&keystore,(CKey *)from);
  coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &coins._M_t._M_impl.super__Rb_tree_header._M_header;
  coins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  coins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  coins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar1 = *(CTxOut **)(this + 0x18);
  coins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       coins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_00 = &std::
             map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
             ::operator[](&coins,&((__return_storage_ptr__->vin).
                                   super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                   super__Vector_impl_data._M_start)->prevout)->out;
  CTxOut::operator=(this_00,pCVar1);
  input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &input_errors._M_t._M_impl.super__Rb_tree_header._M_header;
  input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  input_errors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = (iterator)pubkey;
  msg.m_begin = &key->fCompressed;
  file.m_end = (iterator)0x3b;
  file.m_begin = (iterator)&local_168;
  input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       input_errors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_178,msg);
  local_190.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       SignTransaction(__return_storage_ptr__,&keystore.super_SigningProvider,&coins,1,&input_errors
                      );
  local_190.m_message.px = (element_type *)0x0;
  local_190.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198 = &stack0xfffffffffffffe40;
  local_1b0.m_empty = false;
  local_1b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1a0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_190,&local_1b0,1,0,WARN,_cVar2,(size_t)&stack0xfffffffffffffe30,0x3b);
  boost::detail::shared_count::~shared_count(&local_190.m_message.pn);
  std::
  _Rb_tree<int,_std::pair<const_int,_bilingual_str>,_std::_Select1st<std::pair<const_int,_bilingual_str>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  ::~_Rb_tree(&input_errors._M_t);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::~_Rb_tree(&coins._M_t);
  FillableSigningProvider::~FillableSigningProvider(&keystore);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static CMutableTransaction TestSimpleSpend(const CTransaction& from, uint32_t index, const CKey& key, const CScript& pubkey)
{
    CMutableTransaction mtx;
    mtx.vout.emplace_back(from.vout[index].nValue - DEFAULT_TRANSACTION_MAXFEE, pubkey);
    mtx.vin.push_back({CTxIn{from.GetHash(), index}});
    FillableSigningProvider keystore;
    keystore.AddKey(key);
    std::map<COutPoint, Coin> coins;
    coins[mtx.vin[0].prevout].out = from.vout[index];
    std::map<int, bilingual_str> input_errors;
    BOOST_CHECK(SignTransaction(mtx, &keystore, coins, SIGHASH_ALL, input_errors));
    return mtx;
}